

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

real __thiscall
fasttext::ProductQuantizer::assign_centroid
          (ProductQuantizer *this,real *x,real *c0,uint8_t *code,int32_t d)

{
  undefined1 *in_RCX;
  real *in_RDX;
  real *in_RSI;
  long in_RDI;
  int in_R8D;
  real rVar1;
  real disij;
  int j;
  real dis;
  real *c;
  int local_38;
  float local_34;
  real *local_30;
  
  local_34 = distL2(in_RSI,in_RDX,in_R8D);
  *in_RCX = 0;
  local_30 = in_RDX;
  for (local_38 = 1; local_38 < *(int *)(in_RDI + 4); local_38 = local_38 + 1) {
    local_30 = local_30 + in_R8D;
    rVar1 = distL2(in_RSI,local_30,in_R8D);
    if (rVar1 < local_34) {
      *in_RCX = (char)local_38;
      local_34 = rVar1;
    }
  }
  return local_34;
}

Assistant:

real ProductQuantizer::assign_centroid(
    const real* x,
    const real* c0,
    uint8_t* code,
    int32_t d) const {
  const real* c = c0;
  real dis = distL2(x, c, d);
  code[0] = 0;
  for (auto j = 1; j < ksub_; j++) {
    c += d;
    real disij = distL2(x, c, d);
    if (disij < dis) {
      code[0] = (uint8_t)j;
      dis = disij;
    }
  }
  return dis;
}